

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtof(char *str,float *value)

{
  int *piVar1;
  float fVar2;
  bool local_21;
  char *local_20;
  char *endptr;
  float *value_local;
  char *str_local;
  
  endptr = (char *)value;
  value_local = (float *)str;
  piVar1 = __errno_location();
  *piVar1 = 0;
  fVar2 = strtof((char *)value_local,&local_20);
  *(float *)endptr = fVar2;
  local_21 = false;
  if ((*(char *)value_local != '\0') && (local_21 = false, *local_20 == '\0')) {
    piVar1 = __errno_location();
    local_21 = *piVar1 == 0;
  }
  return local_21;
}

Assistant:

bool safe_strtof(const char* str, float* value) {
  char* endptr;
  errno = 0;  // errno only gets set on errors
#if defined(_WIN32) || defined (__hpux)  // has no strtof()
  *value = internal::NoLocaleStrtod(str, &endptr);
#else
  *value = strtof(str, &endptr);
#endif
  return *str != 0 && *endptr == 0 && errno == 0;
}